

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_large.c
# Opt level: O0

void test_write_format_zip_large(void)

{
  archive_conflict *paVar1;
  int iVar2;
  wchar_t wVar3;
  la_ssize_t lVar4;
  void *__ptr;
  size_t __n;
  char *pcVar5;
  unsigned_long_long uVar6;
  char *pcVar7;
  unsigned_long_long uVar8;
  unsigned_long_long uVar9;
  size_t s;
  size_t buffsize;
  size_t writesize;
  int64_t filesize;
  char *buff;
  int64_t cd_size;
  char *eocd;
  char *zip64_locator;
  char *zip64_eocd;
  char *cd_start;
  char *p;
  archive *a;
  archive_entry *ae;
  fileblocks *fileblocks;
  char namebuff [64];
  uint local_c;
  int i;
  
  ae = (archive_entry *)fileblocks_new();
  nullsize = 0x100000;
  nulldata = malloc(0x100000);
  memset(nulldata,0xaa,nullsize);
  p = (char *)archive_write_new();
  archive_write_set_format_zip((archive *)p);
  iVar2 = archive_write_set_options((archive *)p,"zip:compression=store");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ŏ',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_options(a, \"zip:compression=store\")",p);
  iVar2 = archive_write_set_options((archive *)p,"zip:fakecrc32");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ő',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_options(a, \"zip:fakecrc32\")",p);
  iVar2 = archive_write_set_bytes_per_block((archive *)p,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'œ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_bytes_per_block(a, 0)",p)
  ;
  iVar2 = archive_write_open((archive *)p,ae,(undefined1 *)0x0,memory_write,(undefined1 *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ŕ',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_open(a, fileblocks, NULL, memory_write, NULL)",p);
  for (local_c = 0; test_sizes[(int)local_c] != 0; local_c = local_c + 1) {
    a = (archive *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                     ,L'ś',(uint)((archive_entry *)a != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    snprintf((char *)&fileblocks,0x40,"file_%d",(ulong)local_c);
    archive_entry_copy_pathname((archive_entry *)a,(char *)&fileblocks);
    archive_entry_set_mode((archive_entry *)a,0x81ed);
    writesize = test_sizes[(int)local_c];
    archive_entry_set_size((archive_entry *)a,writesize);
    iVar2 = archive_write_header((archive *)p,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                        ,L'ţ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",p);
    archive_entry_free((archive_entry *)a);
    for (; 0 < (long)writesize; writesize = writesize - buffsize) {
      buffsize = nullsize;
      if ((long)writesize < (long)nullsize) {
        buffsize = writesize;
      }
      lVar4 = archive_write_data((archive *)p,nulldata,buffsize);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                          ,L'Ů',(long)(int)buffsize,"(int)writesize",(long)(int)lVar4,
                          "(int)archive_write_data(a, nulldata, writesize)",p);
    }
  }
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                   ,L'ų',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)a,"lastfile");
  archive_entry_set_mode((archive_entry *)a,0x81ed);
  iVar2 = archive_write_header((archive *)p,(archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                   ,L'Ŷ',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",p);
  archive_entry_free((archive_entry *)a);
  iVar2 = archive_write_close((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ź',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",p);
  iVar2 = archive_write_free((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ż',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  p = (char *)archive_read_new();
  wVar3 = archive_read_support_format_zip_seekable((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƃ',0,"ARCHIVE_OK",(long)wVar3,
                      "archive_read_support_format_zip_seekable(a)",p);
  verify_large_zip((archive *)p,(fileblocks *)ae,1);
  iVar2 = archive_read_free((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƅ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  p = (char *)archive_read_new();
  wVar3 = archive_read_support_format_zip_streamable((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƌ',0,"ARCHIVE_OK",(long)wVar3,
                      "archive_read_support_format_zip_streamable(a)",p);
  verify_large_zip((archive *)p,(fileblocks *)ae,0);
  iVar2 = archive_read_free((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƍ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  __ptr = malloc(0x2000);
  s = 0;
  memory_read_open((archive *)0x0,ae);
  memory_read_seek((archive *)0x0,ae,-0x2000,2);
  while( true ) {
    __n = memory_read((archive *)0x0,ae,&cd_start);
    if (__n == 0) break;
    memcpy((void *)((long)__ptr + s),cd_start,__n);
    s = __n + s;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ɯ',s,"buffsize",0x2000,"FINAL_SIZE",(void *)0x0);
  pcVar5 = (char *)((long)__ptr + s);
  cd_start = pcVar5;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƣ',pcVar5 + -0x16,"eocd","PK\x05\x06","\"PK\\005\\006\\0\\0\\0\\0\"",8,"8"
                      ,(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƣ',pcVar5 + -0xe,"eocd + 8","\b","\"\\010\\0\\010\\0\"",4,"4",(void *)0x0)
  ;
  i4le(pcVar5 + -10);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ʀ',pcVar5 + -6,"eocd + 16",anon_var_dwarf_51e6a,"\"\\xff\\xff\\xff\\xff\""
                      ,4,"4",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƨ',pcVar5 + -2,"eocd + 20","","\"\\0\\0\"",2,"2",(void *)0x0);
  pcVar5 = cd_start;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƫ',cd_start + -0x2a,"zip64_locator","PK\x06\a",
                      "\"PK\\006\\007\\0\\0\\0\\0\"",8,"8",(void *)0x0);
  pcVar7 = cd_start;
  paVar1 = ae->archive;
  uVar6 = i8le(pcVar5 + -0x22);
  pcVar7 = pcVar7 + -((long)paVar1 - uVar6);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƭ',pcVar5 + -0x1a,"zip64_locator + 16","\x01","\"\\001\\0\\0\\0\"",4,"4",
                      (void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                   ,L'ư',(uint)(pcVar7 == cd_start + -0x62),"zip64_eocd == p - 98",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ʊ',pcVar7,"zip64_eocd","PK\x06\x06","\"PK\\006\\006\"",4,"4",(void *)0x0);
  uVar6 = i8le(pcVar7 + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ʋ',0x2c,"44",uVar6,"i8le(zip64_eocd + 4)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƴ',pcVar7 + 0xc,"zip64_eocd + 12","-","\"\\055\\0\"",2,"2",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƴ',pcVar7 + 0xe,"zip64_eocd + 14","-","\"\\055\\0\"",2,"2",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƶ',pcVar7 + 0x10,"zip64_eocd + 16","","\"\\0\\0\\0\\0\"",4,"4",(void *)0x0
                     );
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƶ',pcVar7 + 0x14,"zip64_eocd + 20","","\"\\0\\0\\0\\0\"",4,"4",(void *)0x0
                     );
  uVar6 = i8le(pcVar7 + 0x18);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ʒ',8,"8",uVar6,"i8le(zip64_eocd + 24)",(void *)0x0);
  uVar6 = i8le(pcVar7 + 0x20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ƹ',8,"8",uVar6,"i8le(zip64_eocd + 32)",(void *)0x0);
  uVar6 = i8le(pcVar7 + 0x28);
  pcVar5 = cd_start;
  paVar1 = ae->archive;
  uVar8 = i8le(pcVar7 + 0x30);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                   ,L'Ƽ',(uint)(pcVar5 + -((long)paVar1 - uVar8) + uVar6 == pcVar7),
                   "cd_start + cd_size == zip64_eocd",(void *)0x0);
  uVar9 = i8le(pcVar7 + 0x30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ǃ',uVar9 + uVar6 + 0x62,"i8le(zip64_eocd + 48) + cd_size + 56 + 20 + 22",
                      (longlong)ae->archive,"fileblocks->filesize",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ǆ',pcVar5 + -((long)paVar1 - uVar8),"cd_start","PK\x01\x02",
                      "\"PK\\001\\002\"",4,"4",(void *)0x0);
  fileblocks_free((fileblocks *)ae);
  free(__ptr);
  free(nulldata);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_large)
{
	int i;
	char namebuff[64];
	struct fileblocks *fileblocks = fileblocks_new();
	struct archive_entry *ae;
	struct archive *a;
	const char *p;
	const char *cd_start, *zip64_eocd, *zip64_locator, *eocd;
	int64_t cd_size;
	char *buff;
	int64_t  filesize;
	size_t writesize, buffsize, s;

	nullsize = (size_t)(1 * MB);
	nulldata = malloc(nullsize);
	memset(nulldata, 0xAA, nullsize);

	/*
	 * Open an archive for writing.
	 */
	a = archive_write_new();
	archive_write_set_format_zip(a);
	/* TODO: Repeat this entire test suite with default compression */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:compression=store"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:fakecrc32"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 0)); /* No buffering. */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open(a, fileblocks, NULL, memory_write, NULL));

	/*
	 * Write a series of large files to it.
	 */
	for (i = 0; test_sizes[i] != 0; i++) {
		assert((ae = archive_entry_new()) != NULL);
		snprintf(namebuff, sizeof(namebuff), "file_%d", i);
		archive_entry_copy_pathname(ae, namebuff);
		archive_entry_set_mode(ae, S_IFREG | 0755);
		filesize = test_sizes[i];
		archive_entry_set_size(ae, filesize);

		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_header(a, ae));
		archive_entry_free(ae);

		/*
		 * Write the actual data to the archive.
		 */
		while (filesize > 0) {
			writesize = nullsize;
			if ((int64_t)writesize > filesize)
				writesize = (size_t)filesize;
			assertEqualIntA(a, (int)writesize,
			    (int)archive_write_data(a, nulldata, writesize));
			filesize -= writesize;
		}
	}

	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "lastfile");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Read back with seeking reader:
	 */
	a = archive_read_new();
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_zip_seekable(a));
	verify_large_zip(a, fileblocks, 1);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Read back with streaming reader:
	 */
	a = archive_read_new();
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_zip_streamable(a));
	verify_large_zip(a, fileblocks, 0);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Manually verify some of the final bytes of the archives.
	 */
	/* Collect the final bytes together */
#define FINAL_SIZE 8192
	buff = malloc(FINAL_SIZE);
	buffsize = 0;
	memory_read_open(NULL, fileblocks);
	memory_read_seek(NULL, fileblocks, -FINAL_SIZE, SEEK_END);
	while ((s = memory_read(NULL, fileblocks, (const void **)&p)) > 0) {
		memcpy(buff + buffsize, p, s);
		buffsize += s;
	}
	assertEqualInt(buffsize, FINAL_SIZE);

	p = buff + buffsize;

	/* Verify regular end-of-central-directory record */
	eocd = p - 22;
	assertEqualMem(eocd, "PK\005\006\0\0\0\0", 8);
	assertEqualMem(eocd + 8, "\010\0\010\0", 4); /* 8 entries total */
	cd_size = i4le(eocd + 12);
	/* Start of CD offset should be 0xffffffff */
	assertEqualMem(eocd + 16, "\xff\xff\xff\xff", 4);
	assertEqualMem(eocd + 20, "\0\0", 2);	/* No Zip comment */

	/* Verify Zip64 locator */
	zip64_locator = p - 42;
	assertEqualMem(zip64_locator, "PK\006\007\0\0\0\0", 8);
	zip64_eocd = p - (fileblocks->filesize - i8le(zip64_locator + 8));
	assertEqualMem(zip64_locator + 16, "\001\0\0\0", 4);

	/* Verify Zip64 end-of-cd record. */
	assert(zip64_eocd == p - 98);
	assertEqualMem(zip64_eocd, "PK\006\006", 4);
	assertEqualInt(44, i8le(zip64_eocd + 4)); // Size of EoCD record - 12
	assertEqualMem(zip64_eocd + 12, "\055\0", 2);  // Made by version: 45
	assertEqualMem(zip64_eocd + 14, "\055\0", 2);  // Requires version: 45
	assertEqualMem(zip64_eocd + 16, "\0\0\0\0", 4); // This disk
	assertEqualMem(zip64_eocd + 20, "\0\0\0\0", 4); // Total disks
	assertEqualInt(8, i8le(zip64_eocd + 24));  // Entries on this disk
	assertEqualInt(8, i8le(zip64_eocd + 32));  // Total entries
	cd_size = i8le(zip64_eocd + 40);
	cd_start = p - (fileblocks->filesize - i8le(zip64_eocd + 48));

	assert(cd_start + cd_size == zip64_eocd);

	assertEqualInt(i8le(zip64_eocd + 48) // Start of CD
	    + cd_size
	    + 56 // Size of Zip64 EOCD
	    + 20 // Size of Zip64 locator
	    + 22, // Size of EOCD
	    fileblocks->filesize);

	// TODO: Scan entire Central Directory, sanity-check all data
	assertEqualMem(cd_start, "PK\001\002", 4);

	fileblocks_free(fileblocks);
	free(buff);
	free(nulldata);
}